

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstTestT<unsigned_short>(void)

{
  int iVar1;
  
  if (ConstTestT<unsigned_short>()::t == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstTestT<unsigned_short>()::t);
    if (iVar1 != 0) {
      ConstTestT<unsigned_short>::t = ConstConstructor<unsigned_short>();
      __cxa_guard_release(&ConstTestT<unsigned_short>()::t);
    }
  }
  if (ConstTestT<unsigned_short>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstTestT<unsigned_short>()::b);
    if (iVar1 != 0) {
      ConstTestT<unsigned_short>::b = ConstBool<unsigned_short>();
      __cxa_guard_release(&ConstTestT<unsigned_short>()::b);
    }
  }
  return;
}

Assistant:

void ConstTestT()
	{
		static const T t = ConstConstructor<T>();
		static const bool b = ConstBool<T>();
	}